

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O2

int fts5ApiTokenize(Fts5Context *pCtx,char *pText,int nText,void *pUserData,
                   _func_int_void_ptr_int_char_ptr_int_int_int *xToken)

{
  int iVar1;
  
  iVar1 = fts5ApiTokenize_v2(pCtx,pText,nText,(char *)0x0,0,pUserData,xToken);
  return iVar1;
}

Assistant:

static int fts5ApiTokenize(
  Fts5Context *pCtx,
  const char *pText, int nText,
  void *pUserData,
  int (*xToken)(void*, int, const char*, int, int, int)
){
  return fts5ApiTokenize_v2(pCtx, pText, nText, 0, 0, pUserData, xToken);
}